

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O3

void __thiscall duckdb::BaseStatistics::SetHasNoNull(BaseStatistics *this)

{
  idx_t iVar1;
  BaseStatistics *this_00;
  idx_t iVar2;
  
  this->has_no_null = true;
  if (((this->type).physical_type_ == STRUCT) &&
     (iVar1 = StructType::GetChildCount(&this->type), iVar1 != 0)) {
    iVar1 = 0;
    do {
      this_00 = StructStats::GetChildStats(this,iVar1);
      SetHasNoNull(this_00);
      iVar1 = iVar1 + 1;
      iVar2 = StructType::GetChildCount(&this->type);
    } while (iVar1 < iVar2);
  }
  return;
}

Assistant:

void BaseStatistics::SetHasNoNull() {
	has_no_null = true;
	if (type.InternalType() == PhysicalType::STRUCT) {
		for (idx_t c = 0; c < StructType::GetChildCount(type); c++) {
			StructStats::GetChildStats(*this, c).SetHasNoNull();
		}
	}
}